

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::HaltonSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,HaltonSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  Tuple2<pbrt::Point2,_int> *pTVar2;
  undefined8 uVar3;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  undefined4 uVar12;
  HaltonSampler *pHVar13;
  pointer pSVar14;
  long lVar15;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pHVar13 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::HaltonSampler>
                      (&local_30,(long)n);
  pSVar14 = (__return_storage_ptr__->
            super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar15 = 0; (ulong)(uint)(~(n >> 0x1f) & n) * 0x38 - lVar15 != 0; lVar15 = lVar15 + 0x38) {
    uVar3 = *(undefined8 *)this;
    pvVar4 = this->digitPermutations;
    TVar5 = (this->baseScales).super_Tuple2<pbrt::Point2,_int>;
    TVar6 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>;
    iVar7 = this->multInverse[0];
    iVar8 = this->multInverse[1];
    uVar9 = *(undefined4 *)&this->haltonIndex;
    uVar10 = *(undefined4 *)((long)&this->haltonIndex + 4);
    iVar11 = this->dimension;
    uVar12 = *(undefined4 *)&this->field_0x34;
    pTVar2 = (Tuple2<pbrt::Point2,_int> *)((long)pHVar13->multInverse + lVar15 + -8);
    *pTVar2 = (this->baseExponents).super_Tuple2<pbrt::Point2,_int>;
    pTVar2[1].x = iVar7;
    pTVar2[1].y = iVar8;
    pTVar2[2].x = uVar9;
    pTVar2[2].y = uVar10;
    pTVar2[3].x = iVar11;
    pTVar2[3].y = uVar12;
    puVar1 = (undefined8 *)((long)pHVar13->multInverse + lVar15 + -0x20);
    *puVar1 = uVar3;
    puVar1[1] = pvVar4;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 2) = TVar5;
    *(Tuple2<pbrt::Point2,_int> *)(puVar1 + 3) = TVar6;
    (pSVar14->
    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
    ).bits = (long)pHVar13->multInverse + lVar15 + -0x20 | 0x3000000000000;
    pSVar14 = pSVar14 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> HaltonSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    HaltonSampler *samplerMem = (HaltonSampler *)alloc.allocate_object<HaltonSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}